

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O2

string * __thiscall
cmCTestSubmitHandler::GetSubmitResultsPrefix_abi_cxx11_
          (string *__return_storage_ptr__,cmCTestSubmitHandler *this)

{
  cmCTest *pcVar1;
  string buildname;
  allocator<char> local_179;
  string local_178;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"BuildName",(allocator<char> *)&local_138);
  cmCTest::GetCTestConfiguration(&local_158,pcVar1,&local_178);
  cmCTest::SafeBuildIdField(&local_38,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Site",&local_179);
  cmCTest::GetCTestConfiguration(&local_b8,pcVar1,&local_d8);
  std::operator+(&local_98,&local_b8,"___");
  std::operator+(&local_78,&local_98,&local_38);
  std::operator+(&local_58,&local_78,"___");
  cmCTest::GetCurrentTag_abi_cxx11_(&local_f8,(this->super_cmCTestGenericHandler).CTest);
  std::operator+(&local_138,&local_58,&local_f8);
  std::operator+(&local_178,&local_138,"-");
  cmCTest::GetTestModelString_abi_cxx11_(&local_118,(this->super_cmCTestGenericHandler).CTest);
  std::operator+(&local_158,&local_178,&local_118);
  std::operator+(__return_storage_ptr__,&local_158,"___XML___");
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestSubmitHandler::GetSubmitResultsPrefix()
{
  std::string buildname =
    cmCTest::SafeBuildIdField(this->CTest->GetCTestConfiguration("BuildName"));
  std::string name = this->CTest->GetCTestConfiguration("Site") + "___" +
    buildname + "___" + this->CTest->GetCurrentTag() + "-" +
    this->CTest->GetTestModelString() + "___XML___";
  return name;
}